

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysc_node_action * lysc_node_actions(lysc_node *node)

{
  lysc_node_action **pplVar1;
  lysc_node_action **actions;
  lysc_node *node_local;
  
  pplVar1 = lysc_node_actions_p(node);
  if (pplVar1 == (lysc_node_action **)0x0) {
    node_local = (lysc_node *)0x0;
  }
  else {
    node_local = (lysc_node *)*pplVar1;
  }
  return (lysc_node_action *)node_local;
}

Assistant:

lysc_node_action *
lysc_node_actions(const struct lysc_node *node)
{
    struct lysc_node_action **actions;

    actions = lysc_node_actions_p((struct lysc_node *)node);
    if (actions) {
        return *actions;
    } else {
        return NULL;
    }
}